

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

_Bool btorsim_bv_is_one(BtorSimBitVector *bv)

{
  uint32_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = (ulong)(bv->len - 1);
  if ((&bv[1].width)[uVar2] != 1) {
    return false;
  }
  uVar3 = 0;
  do {
    bVar4 = uVar2 == uVar3;
    if (bVar4) {
      return bVar4;
    }
    puVar1 = &bv[1].width + uVar3;
    uVar3 = uVar3 + 1;
  } while (*puVar1 == 0);
  return bVar4;
}

Assistant:

bool
btorsim_bv_is_one (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t i;

  if (bv->bits[bv->len - 1] != 1) return false;
  for (i = 0; i < bv->len - 1; i++)
    if (bv->bits[i] != 0) return false;
  return true;
}